

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.cpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::apply
          (Phase<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  undefined1 local_40 [16];
  double local_30;
  
  iVar1 = (*(this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[3])();
  local_40._8_8_ = (this->angle_).cos_;
  local_30 = (this->angle_).sin_;
  local_40._0_8_ = *(undefined8 *)vector;
  if (op == ConjTrans) {
    local_30 = -local_30;
  }
  apply2b<qclab::qgates::lambda_Phase<std::complex<double>>(qclab::Op,std::complex<double>&,std::complex<double>*)::_lambda(unsigned_long)_1_>
            (nbQubits,iVar1 + offset,(anon_class_24_2_357f297d *)local_40);
  return;
}

Assistant:

void Phase< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply2b( nbQubits , qubit , f ) ;
  }